

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tiles.cpp
# Opt level: O3

void __thiscall sfc::Tileset::save(Tileset *this,string *path)

{
  byte_vec_t local_220;
  long local_208;
  filebuf local_200 [240];
  ios_base local_110 [264];
  
  native_data(&local_220,this);
  std::ofstream::ofstream(&local_208,(string *)path,_S_trunc|_S_out|_S_bin);
  std::ostream::write((char *)&local_208,
                      (long)local_220.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
  local_208 = _VTT;
  *(undefined8 *)(local_200 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_200);
  std::ios_base::~ios_base(local_110);
  if (local_220.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_220.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_220.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_220.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Tileset::save(const std::string& path) const {
  write_file(path, native_data());
}